

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O0

double __thiscall
RandomGen::rand_exponential(RandomGen *this,double half_life,double t_min,double t_max)

{
  double dVar1;
  double dVar2;
  undefined8 local_40;
  double r_max;
  double r_min;
  double r;
  double t_max_local;
  double t_min_local;
  double half_life_local;
  RandomGen *this_local;
  
  dVar1 = rand_uniform(this);
  r_max = 0.0;
  local_40 = 1.0;
  if (0.0 <= t_min) {
    dVar2 = exp((-t_min * 0.6931471805599453) / half_life);
    r_max = 1.0 - dVar2;
  }
  if (0.0 <= t_max) {
    local_40 = exp((-t_max * 0.6931471805599453) / half_life);
    local_40 = 1.0 - local_40;
  }
  dVar1 = log(1.0 - ((local_40 - r_max) * dVar1 + r_max));
  return (-dVar1 * half_life) / 0.6931471805599453;
}

Assistant:

double RandomGen::rand_exponential(double half_life, double t_min,
                                   double t_max) {
  double r = rand_uniform();
  double r_min = 0;
  double r_max = 1;
  if (t_min >= 0) {
    r_min = 1 - exp(-t_min * log2 / half_life);
  }
  if (t_max >= 0) {
    r_max = 1 - exp(-t_max * log2 / half_life);
  }
  r = (r_max - r_min) * r + r_min;
  return -log(1 - r) * half_life / log2;
}